

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

STAmount * jbcoin::operator+(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2)

{
  bool bVar1;
  int exponent;
  int64_t iVar2;
  int64_t iVar3;
  uint64_t uVar4;
  SField *pSVar5;
  Issue *pIVar6;
  int64_t fv;
  int64_t vv2;
  int64_t vv1;
  int local_28;
  int ov2;
  int ov1;
  STAmount *v2_local;
  STAmount *v1_local;
  
  bVar1 = areComparable(v1,v2);
  if (bVar1) {
    bVar1 = beast::operator==(v2);
    if (bVar1) {
      STAmount::STAmount(__return_storage_ptr__,v1);
    }
    else {
      bVar1 = beast::operator==(v1);
      if (bVar1) {
        pSVar5 = STBase::getFName(&v1->super_STBase);
        pIVar6 = STAmount::issue(v1);
        uVar4 = STAmount::mantissa(v2);
        exponent = STAmount::exponent(v2);
        bVar1 = STAmount::negative(v2);
        STAmount::STAmount(__return_storage_ptr__,pSVar5,pIVar6,uVar4,exponent,bVar1);
      }
      else {
        bVar1 = STAmount::native(v1);
        if (bVar1) {
          pSVar5 = STBase::getFName(&v1->super_STBase);
          iVar2 = getSNValue(v1);
          iVar3 = getSNValue(v2);
          STAmount::STAmount(__return_storage_ptr__,pSVar5,iVar2 + iVar3);
        }
        else {
          local_28 = STAmount::exponent(v1);
          vv1._4_4_ = STAmount::exponent(v2);
          vv2 = STAmount::mantissa(v1);
          fv = STAmount::mantissa(v2);
          bVar1 = STAmount::negative(v1);
          if (bVar1) {
            vv2 = -vv2;
          }
          bVar1 = STAmount::negative(v2);
          if (bVar1) {
            fv = -fv;
          }
          for (; local_28 < vv1._4_4_; local_28 = local_28 + 1) {
            vv2 = vv2 / 10;
          }
          for (; vv1._4_4_ < local_28; vv1._4_4_ = vv1._4_4_ + 1) {
            fv = fv / 10;
          }
          uVar4 = vv2 + fv;
          if (((long)uVar4 < -10) || (10 < (long)uVar4)) {
            if ((long)uVar4 < 0) {
              pSVar5 = STBase::getFName(&v1->super_STBase);
              pIVar6 = STAmount::issue(v1);
              STAmount::STAmount(__return_storage_ptr__,pSVar5,pIVar6,-uVar4,local_28,true);
            }
            else {
              pSVar5 = STBase::getFName(&v1->super_STBase);
              pIVar6 = STAmount::issue(v1);
              STAmount::STAmount(__return_storage_ptr__,pSVar5,pIVar6,uVar4,local_28,false);
            }
          }
          else {
            pSVar5 = STBase::getFName(&v1->super_STBase);
            pIVar6 = STAmount::issue(v1);
            STAmount::STAmount(__return_storage_ptr__,pSVar5,pIVar6,0,0,false);
          }
        }
      }
    }
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[41]>
            ((char (*) [41])"Can\'t add amounts that are\'t comparable!");
}

Assistant:

STAmount operator+ (STAmount const& v1, STAmount const& v2)
{
    if (!areComparable (v1, v2))
        Throw<std::runtime_error> ("Can't add amounts that are't comparable!");

    if (v2 == zero)
        return v1;

    if (v1 == zero)
    {
        // Result must be in terms of v1 currency and issuer.
        return { v1.getFName (), v1.issue (),
            v2.mantissa (), v2.exponent (), v2.negative () };
    }

    if (v1.native ())
        return { v1.getFName (), getSNValue (v1) + getSNValue (v2) };

    int ov1 = v1.exponent (), ov2 = v2.exponent ();
    std::int64_t vv1 = static_cast<std::int64_t>(v1.mantissa ());
    std::int64_t vv2 = static_cast<std::int64_t>(v2.mantissa ());

    if (v1.negative ())
        vv1 = -vv1;

    if (v2.negative ())
        vv2 = -vv2;

    while (ov1 < ov2)
    {
        vv1 /= 10;
        ++ov1;
    }

    while (ov2 < ov1)
    {
        vv2 /= 10;
        ++ov2;
    }

    // This addition cannot overflow an std::int64_t. It can overflow an
    // STAmount and the constructor will throw.

    std::int64_t fv = vv1 + vv2;

    if ((fv >= -10) && (fv <= 10))
        return { v1.getFName (), v1.issue () };

    if (fv >= 0)
        return STAmount { v1.getFName (), v1.issue (),
            static_cast<std::uint64_t>(fv), ov1, false };

    return STAmount { v1.getFName (), v1.issue (),
        static_cast<std::uint64_t>(-fv), ov1, true };
}